

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYWriter::~PLYWriter(PLYWriter *this)

{
  value_type pPVar1;
  PLYElement *pPVar2;
  reference ppPVar3;
  long in_RDI;
  size_t i;
  PLYElement *this_00;
  PLYElement *this_01;
  
  this_00 = (PLYElement *)0x0;
  while( true ) {
    this_01 = this_00;
    pPVar2 = (PLYElement *)
             std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                       ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                        (in_RDI + 8));
    if (pPVar2 <= this_00) break;
    ppPVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 8),(size_type)this_01);
    pPVar1 = *ppPVar3;
    if (pPVar1 != (value_type)0x0) {
      PLYElement::~PLYElement(this_00);
      operator_delete(pPVar1);
    }
    this_00 = (PLYElement *)&this_01->field_0x1;
  }
  std::ofstream::~ofstream((void *)(in_RDI + 0x48));
  std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::~vector
            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)this_01);
  return;
}

Assistant:

PLYWriter::~PLYWriter()
{
  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }
}